

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-shutdown-twice.c
# Opt level: O1

void shutdown_cb(uv_shutdown_t *req,int status)

{
  void *pvVar1;
  undefined8 *extraout_RDX;
  undefined8 *__size;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 local_10;
  size_t local_8;
  
  if (req == &shutdown_req) {
    local_8 = (size_t)status;
    local_10 = 0;
    if (local_8 != 0) goto LAB_001d1b5a;
    local_8 = (shutdown_req.handle)->write_queue_size;
    local_10 = 0;
    if (local_8 == 0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      local_8 = (size_t)write_cb_called;
      local_10 = 3;
      if (local_8 == 3) {
        return;
      }
      goto LAB_001d1b78;
    }
  }
  else {
    shutdown_cb_cold_1();
LAB_001d1b5a:
    shutdown_cb_cold_2();
  }
  shutdown_cb_cold_3();
LAB_001d1b78:
  __size = &local_10;
  shutdown_cb_cold_4();
  pvVar1 = malloc((size_t)__size);
  *extraout_RDX = pvVar1;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void shutdown_cb(uv_shutdown_t* req, int status) {
  ASSERT_PTR_EQ(req, &req1);
  ASSERT_OK(status);
  shutdown_cb_called++;
  uv_close((uv_handle_t*) req->handle, close_cb);
}